

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iffl_list.h
# Opt level: O1

void __thiscall
iffl::
flat_forward_list<pod_array_list_entry<char>,_iffl::flat_forward_list_traits<pod_array_list_entry<char>_>,_std::pmr::polymorphic_allocator<char>_>
::resize_buffer(flat_forward_list<pod_array_list_entry<char>,_iffl::flat_forward_list_traits<pod_array_list_entry<char>_>,_std::pmr::polymorphic_allocator<char>_>
                *this,size_type size)

{
  buffer_t<char> *this_00;
  memory_resource *pmVar1;
  bool bVar2;
  ushort *puVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ushort *puVar7;
  long lVar8;
  pointer_type pcVar9;
  char *new_buffer;
  size_t new_buffer_size;
  scope_guard<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_vladp72[P]iffl_include_iffl_list_h:5640:33)>
  deallocate_buffer;
  flat_forward_list_ref<pod_array_list_entry<char>,_iffl::flat_forward_list_traits<pod_array_list_entry<char>_>_>
  buffer_view;
  sizes_t prev_sizes;
  char *local_d8;
  size_t local_d0;
  flat_forward_list<pod_array_list_entry<char>,_iffl::flat_forward_list_traits<pod_array_list_entry<char>_>,_std::pmr::polymorphic_allocator<char>_>
  *local_c8;
  undefined8 *local_c0;
  size_t *local_b8;
  char local_b0;
  ushort *local_a8;
  ushort *puStack_a0;
  pointer_type local_98;
  undefined1 local_88 [32];
  sizes_t local_68;
  buffer_t<char> local_48;
  
  this_00 = &(this->buffer_).v2_;
  buffer_t<char>::validate(this_00);
  get_all_sizes(&local_68,this);
  local_d8 = (char *)0x0;
  local_b8 = &local_d0;
  local_d0 = 0;
  local_b0 = '\x01';
  local_c8 = this;
  if (local_68.total_capacity < size) {
    pmVar1 = (this->buffer_).v1_._M_resource;
    local_c0 = &local_d8;
    local_d8 = (char *)(**(code **)(*(long *)pmVar1 + 0x10))(pmVar1,size,1);
    local_d0 = size;
    if ((this->buffer_).v2_.last != (pointer_type)0x0) {
      memcpy(local_d8,(this->buffer_).v2_.begin,local_68.last_element.super_range.data_end);
      (this->buffer_).v2_.last = local_d8 + local_68.last_element.super_range.buffer_begin;
    }
  }
  else {
    if (size == 0) {
      local_c0 = &local_d8;
      clear(this);
      goto LAB_0010dd71;
    }
    local_c0 = &local_d8;
    if (local_68.total_capacity <= size) goto LAB_0010dd71;
    pmVar1 = (this->buffer_).v1_._M_resource;
    local_c0 = &local_d8;
    local_d8 = (char *)(**(code **)(*(long *)pmVar1 + 0x10))(pmVar1,size,1);
    if (size < local_68.last_element.super_range.data_end) {
      local_a8 = (ushort *)0x0;
      puStack_a0 = (ushort *)0x0;
      local_98 = (pointer_type)0x0;
      puVar7 = (ushort *)this_00->begin;
      local_d0 = size;
      if ((puVar7 == (ushort *)0x0) || ((long)size < 0)) {
LAB_0010dd01:
        std::terminate();
      }
      local_48.end = (pointer_type)((long)puVar7 + size);
      if ((long)size < 2) {
        bVar2 = true;
        local_48.last = (pointer_type)0x0;
      }
      else {
        uVar4 = (ulong)*puVar7;
        uVar6 = size;
        puVar3 = puVar7;
        if (size < uVar4 + 2) {
          local_48.last = (pointer_type)0x0;
          bVar2 = false;
        }
        else {
          do {
            local_48.last = (pointer_type)puVar3;
            uVar5 = (ulong)((int)uVar4 + 3U & 0x1fffe);
            uVar6 = uVar6 - uVar5;
            bVar2 = (long)uVar6 < 2;
            if ((long)uVar6 < 2) break;
            uVar4 = (ulong)*(ushort *)((long)local_48.last + uVar5);
            puVar3 = (ushort *)((long)local_48.last + uVar5);
          } while (uVar4 + 2 <= uVar6);
        }
      }
      local_48.begin = (pointer_type)puVar7;
      buffer_t<char>::validate(&local_48);
      local_88._23_8_ = local_48.end;
      local_88[7] = SUB81(local_48.begin,0);
      local_88._8_7_ = (undefined7)((ulong)local_48.begin >> 8);
      local_88._15_8_ = local_48.last;
      local_a8 = (ushort *)local_48.begin;
      puStack_a0 = (ushort *)local_48.last;
      local_98 = local_48.end;
      if (bVar2) {
        flat_forward_list_ref<pod_array_list_entry<char>,_iffl::flat_forward_list_traits<pod_array_list_entry<char>_>_>
        ::last((flat_forward_list_ref<pod_array_list_entry<char>,_iffl::flat_forward_list_traits<pod_array_list_entry<char>_>_>
                *)local_88);
        if ((pointer_type)CONCAT17(local_88[7],local_88._0_7_) != (this->buffer_).v2_.last)
        goto LAB_0010dd01;
      }
      else {
        flat_forward_list_ref<pod_array_list_entry<char>,_iffl::flat_forward_list_traits<pod_array_list_entry<char>_>_>
        ::last((flat_forward_list_ref<pod_array_list_entry<char>,_iffl::flat_forward_list_traits<pod_array_list_entry<char>_>_>
                *)local_88);
        if ((pointer_type)CONCAT17(local_88[7],local_88._0_7_) == (this->buffer_).v2_.last)
        goto LAB_0010dd01;
      }
      flat_forward_list_ref<pod_array_list_entry<char>,_iffl::flat_forward_list_traits<pod_array_list_entry<char>_>_>
      ::last((flat_forward_list_ref<pod_array_list_entry<char>,_iffl::flat_forward_list_traits<pod_array_list_entry<char>_>_>
              *)local_88);
      puVar7 = (ushort *)CONCAT17(local_88[7],local_88._0_7_);
    }
    else {
      puVar7 = (ushort *)(this->buffer_).v2_.last;
      local_d0 = size;
    }
    if (puVar7 == (ushort *)0x0) {
      pcVar9 = (pointer_type)0x0;
    }
    else {
      lVar8 = (long)puVar7 - (long)this_00->begin;
      memcpy(local_d8,this_00->begin,(ulong)*puVar7 + lVar8 + 2);
      pcVar9 = local_d8 + lVar8;
    }
    (this->buffer_).v2_.last = pcVar9;
  }
  commit_new_buffer(this,&local_d8,&local_d0);
  (this->buffer_).v2_.end = (this->buffer_).v2_.begin + size;
LAB_0010dd71:
  buffer_t<char>::validate(this_00);
  validate_data_invariants(this);
  if ((local_b0 == '\x01') && ((char *)*local_c0 != (char *)0x0)) {
    flat_forward_list<pod_array_list_entry<char>,_iffl::flat_forward_list_traits<pod_array_list_entry<char>_>,_std::pmr::polymorphic_allocator<char>_>
    ::deallocate_buffer(local_c8,(char *)*local_c0,*local_b8);
    *local_c0 = 0;
    *local_b8 = 0;
  }
  return;
}

Assistant:

void resize_buffer(size_type size) {
        validate_pointer_invariants();

        sizes_t const prev_sizes{ get_all_sizes() };

        char *new_buffer{ nullptr };
        size_t new_buffer_size{ 0 };
        auto deallocate_buffer{ make_scoped_deallocator(&new_buffer, &new_buffer_size) };
        //
        // growing capacity
        //
        if (prev_sizes.total_capacity < size) {
            new_buffer = allocate_buffer(size);
            new_buffer_size = size;
            if (nullptr != buff().last) {
                copy_data(new_buffer, buff().begin, prev_sizes.used_capacity().size);
                buff().last = new_buffer + prev_sizes.last_element.begin();
            }
            commit_new_buffer(new_buffer, new_buffer_size);
            buff().end = buff().begin + size;
        //
        // shrinking to 0 is simple
        //
        } else if (0 == size) {
            clear();
        //
        // to shrink to a smaller size we first need to 
        // find last element that would completely fit 
        // in the new buffer, and if we found any, then
        // make it new last element. If we did not find 
        // any, then designate that there are no last 
        // element
        //
        } else if (prev_sizes.total_capacity > size) {

            new_buffer = allocate_buffer(size);
            new_buffer_size = size;

            bool is_valid{ true };
            char *last_valid{ buff().last };
            //
            // If we are shrinking below used capacity then last element will
            // be removed, and we need to do linear search for the new last element 
            // that would fit new buffer size.
            //
            if (prev_sizes.used_capacity().size > size) {
                flat_forward_list_ref<T, TT> buffer_view;
                std::tie(is_valid, buffer_view) = flat_forward_list_validate<T, TT>(buff().begin,
                                                                                    buff().begin + size);
                if (is_valid) {
                    FFL_CODDING_ERROR_IF_NOT(buffer_view.last().get_ptr() == buff().last);
                } else {
                    FFL_CODDING_ERROR_IF_NOT(buffer_view.last().get_ptr() != buff().last);
                }
                last_valid = buffer_view.last().get_ptr();
            }

            if (last_valid) {
                size_type new_last_element_offset = last_valid - buff().begin;

                size_with_padding_t const last_valid_element_size{ traits_traits::get_size(last_valid) };
                size_type const new_used_capacity{ new_last_element_offset + last_valid_element_size.size };
                
                set_no_next_element(last_valid);
                
                copy_data(new_buffer, buff().begin, new_used_capacity);
                buff().last = new_buffer + new_last_element_offset;
            } else {
                buff().last = nullptr;
            }

            commit_new_buffer(new_buffer, new_buffer_size);
            buff().end = buff().begin + size;
        }

        validate_pointer_invariants();
        validate_data_invariants();
    }